

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O3

void eia608_dump(uint16_t cc_data)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char char2 [5];
  char char1 [5];
  undefined8 in_stack_ffffffffffffffd8;
  char local_1e [5];
  char local_19 [5];
  int local_14;
  
  local_1e[0] = '\0';
  local_19[0] = '\0';
  uVar4 = (uint)cc_data;
  uVar3 = uVar4 & 0x7f7f;
  uVar2 = (uint)cc_data;
  if (CONCAT11(eia608_parity_table[(byte)(cc_data >> 8) & 0x7f],eia608_parity_table[uVar4 & 0x7f])
      == cc_data) {
    if ((short)uVar3 == 0) {
      pcVar1 = "pad";
      uVar3 = 0;
    }
    else if ((cc_data & 0x6000) == 0) {
      if ((cc_data & 6000) == 0x1130) {
        eia608_to_utf8(cc_data,&local_14,local_19,local_1e);
        pcVar1 = "specialna";
      }
      else if ((cc_data & 0x1660) == 0x1220) {
        eia608_to_utf8(cc_data,&local_14,local_19,local_1e);
        pcVar1 = "westeu";
      }
      else if ((cc_data & 0x1070) == 0 && (cc_data & 0xf0f) != 0) {
        pcVar1 = "xds";
      }
      else if ((cc_data & 6000) == 0x1120) {
        pcVar1 = "midrowchange";
      }
      else {
        pcVar1 = "norpak";
        if (((short)(uVar4 & 0x177c) != 0x1724) && ((uVar4 & 0x177c) != 0x1728)) {
          if ((~uVar4 & 0x1040) == 0) {
            uVar4 = cc_data >> 1 & 7;
            if ((cc_data & 0x10) != 0) {
              uVar4 = 0;
            }
            fprintf(_stderr,"preamble %d %d %d %d %d\n",
                    (ulong)(uint)eia608_row_map[cc_data >> 5 & 1 | cc_data >> 7 & 0xe],
                    (ulong)(cc_data + uVar2 & (int)(uVar2 << 0x1b) >> 0x1f & 0x1c),(ulong)uVar4,
                    (ulong)(cc_data >> 0xb & 1),
                    CONCAT44((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),uVar2) &
                    0xffffffff00000001);
            pcVar1 = "preamble";
          }
          else if ((uVar2 & 0x1670) == 0x1420 || (uVar2 & 6000) == 0x1720) {
            uVar2 = 0x172f;
            if ((cc_data >> 9 & 1) == 0) {
              uVar2 = 0x142f;
            }
            uVar2 = uVar2 & cc_data;
            pcVar1 = "unknown_control";
            switch(uVar2) {
            case 0x1420:
              pcVar1 = "eia608_control_resume_caption_loading";
              break;
            case 0x1421:
              pcVar1 = "eia608_control_backspace";
              break;
            case 0x1422:
              pcVar1 = "eia608_control_alarm_off";
              break;
            case 0x1423:
              pcVar1 = "eia608_control_alarm_on";
              break;
            case 0x1424:
              pcVar1 = "eia608_control_delete_to_end_of_row";
              break;
            case 0x1425:
              pcVar1 = "eia608_control_roll_up_2";
              break;
            case 0x1426:
              pcVar1 = "eia608_control_roll_up_3";
              break;
            case 0x1427:
              pcVar1 = "eia608_control_roll_up_4";
              break;
            case 0x1428:
              break;
            case 0x1429:
              pcVar1 = "eia608_control_resume_direct_captioning";
              break;
            case 0x142a:
              pcVar1 = "eia608_control_text_restart";
              break;
            case 0x142b:
              pcVar1 = "eia608_control_text_resume_text_display";
              break;
            case 0x142c:
              pcVar1 = "eia608_control_erase_display_memory";
              break;
            case 0x142d:
              pcVar1 = "eia608_control_carriage_return";
              break;
            case 0x142e:
              pcVar1 = "eia608_control_erase_non_displayed_memory";
              break;
            case 0x142f:
              pcVar1 = "eia608_control_end_of_caption";
              break;
            default:
              switch(uVar2) {
              case 0x1720:
                pcVar1 = "eia608_tab_offset_0";
                break;
              case 0x1721:
                pcVar1 = "eia608_tab_offset_1";
                break;
              case 0x1722:
                pcVar1 = "eia608_tab_offset_2";
                break;
              case 0x1723:
                pcVar1 = "eia608_tab_offset_3";
              }
            }
          }
          else {
            pcVar1 = "unhandled";
          }
        }
      }
    }
    else {
      eia608_to_utf8(cc_data,&local_14,local_19,local_1e);
      pcVar1 = "basicna";
    }
  }
  else {
    pcVar1 = "parity failed";
  }
  fprintf(_stderr,"cc %04X (%04X) \'%s\' \'%s\' (%s)\n",cc_data,(ulong)uVar3,local_19,local_1e,
          pcVar1);
  return;
}

Assistant:

void eia608_dump(uint16_t cc_data)
{
    eia608_style_t style;
    const char* text = 0;
    char char1[5], char2[5];
    char1[0] = char2[0] = 0;
    int row, col, chan, underline;

    if (!eia608_parity_varify(cc_data)) {
        text = "parity failed";
    } else if (0 == eia608_parity_strip(cc_data)) {
        text = "pad";
    } else if (eia608_is_basicna(cc_data)) {
        text = "basicna";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_specialna(cc_data)) {
        text = "specialna";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_westeu(cc_data)) {
        text = "westeu";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_xds(cc_data)) {
        text = "xds";
    } else if (eia608_is_midrowchange(cc_data)) {
        text = "midrowchange";
    } else if (eia608_is_norpak(cc_data)) {
        text = "norpak";
    } else if (eia608_is_preamble(cc_data)) {
        text = "preamble";
        eia608_parse_preamble(cc_data, &row, &col, &style, &chan, &underline);
        fprintf(stderr, "preamble %d %d %d %d %d\n", row, col, style, chan, underline);

    } else if (eia608_is_control(cc_data)) {
        switch (eia608_parse_control(cc_data, &chan)) {

        default:
            text = "unknown_control";
            break;

        case eia608_tab_offset_0:
            text = "eia608_tab_offset_0";
            break;

        case eia608_tab_offset_1:
            text = "eia608_tab_offset_1";
            break;

        case eia608_tab_offset_2:
            text = "eia608_tab_offset_2";
            break;

        case eia608_tab_offset_3:
            text = "eia608_tab_offset_3";
            break;

        case eia608_control_resume_caption_loading:
            text = "eia608_control_resume_caption_loading";
            break;

        case eia608_control_backspace:
            text = "eia608_control_backspace";
            break;

        case eia608_control_alarm_off:
            text = "eia608_control_alarm_off";
            break;

        case eia608_control_alarm_on:
            text = "eia608_control_alarm_on";
            break;

        case eia608_control_delete_to_end_of_row:
            text = "eia608_control_delete_to_end_of_row";
            break;

        case eia608_control_roll_up_2:
            text = "eia608_control_roll_up_2";
            break;

        case eia608_control_roll_up_3:
            text = "eia608_control_roll_up_3";
            break;

        case eia608_control_roll_up_4:
            text = "eia608_control_roll_up_4";
            break;

        case eia608_control_resume_direct_captioning:
            text = "eia608_control_resume_direct_captioning";
            break;

        case eia608_control_text_restart:
            text = "eia608_control_text_restart";
            break;

        case eia608_control_text_resume_text_display:
            text = "eia608_control_text_resume_text_display";
            break;

        case eia608_control_erase_display_memory:
            text = "eia608_control_erase_display_memory";
            break;

        case eia608_control_carriage_return:
            text = "eia608_control_carriage_return";
            break;

        case eia608_control_erase_non_displayed_memory:
            text = "eia608_control_erase_non_displayed_memory";
            break;

        case eia608_control_end_of_caption:
            text = "eia608_control_end_of_caption";
            break;
        }
    } else {
        text = "unhandled";
    }

    fprintf(stderr, "cc %04X (%04X) '%s' '%s' (%s)\n", cc_data, eia608_parity_strip(cc_data), char1, char2, text);
}